

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

void __thiscall
icu_63::Locale::getUnicodeKeywordValue
          (Locale *this,StringPiece keywordName,ByteSink *sink,UErrorCode *status)

{
  char *pcVar1;
  size_t sVar2;
  StringPiece keywordName_00;
  CharStringByteSink sink_1;
  CharString keywordName_nul;
  CharString legacy_value;
  CharStringByteSink local_d0;
  undefined1 local_c0 [12];
  CharString local_b0;
  CharString local_70;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_b0.buffer);
  local_b0.len = 0;
  *local_b0.buffer.ptr = '\0';
  CharString::append(&local_b0,keywordName.ptr_,keywordName.length_,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar1 = uloc_toLegacyKey_63(local_b0.buffer.ptr);
    if (pcVar1 == (char *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      MaybeStackArray<char,_40>::MaybeStackArray(&local_70.buffer);
      local_70.len = 0;
      *local_70.buffer.ptr = '\0';
      CharStringByteSink::CharStringByteSink(&local_d0,&local_70);
      StringPiece::StringPiece((StringPiece *)local_c0,pcVar1);
      keywordName_00._12_4_ = 0;
      keywordName_00.ptr_ = (char *)local_c0._0_8_;
      keywordName_00.length_ = local_c0._8_4_;
      getKeywordValue(this,keywordName_00,&local_d0.super_ByteSink,status);
      CharStringByteSink::~CharStringByteSink(&local_d0);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar1 = uloc_toUnicodeLocaleType_63(local_b0.buffer.ptr,local_70.buffer.ptr);
        if (pcVar1 == (char *)0x0) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          sVar2 = strlen(pcVar1);
          (*sink->_vptr_ByteSink[2])(sink,pcVar1,sVar2 & 0xffffffff);
        }
      }
      MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
    }
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_b0.buffer);
  return;
}

Assistant:

void
Locale::getUnicodeKeywordValue(StringPiece keywordName,
                               ByteSink& sink,
                               UErrorCode& status) const {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    if (U_FAILURE(status)) {
        return;
    }

    const char* legacy_key = uloc_toLegacyKey(keywordName_nul.data());

    if (legacy_key == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    CharString legacy_value;
    {
        CharStringByteSink sink(&legacy_value);
        getKeywordValue(legacy_key, sink, status);
    }

    if (U_FAILURE(status)) {
        return;
    }

    const char* unicode_value = uloc_toUnicodeLocaleType(
            keywordName_nul.data(), legacy_value.data());

    if (unicode_value == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    sink.Append(unicode_value, static_cast<int32_t>(uprv_strlen(unicode_value)));
}